

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O2

void __thiscall
presolve::HighsPostsolveStack::freeColSubstitution<HighsTripletPositionSlice,HighsTripletListSlice>
          (HighsPostsolveStack *this,HighsInt row,HighsInt col,double rhs,double colCost,
          RowType rowType,HighsMatrixSlice<HighsTripletPositionSlice> *rowVec,
          HighsMatrixSlice<HighsTripletListSlice> *colVec)

{
  HighsDataStack *this_00;
  int iVar1;
  int iVar2;
  pointer pNVar3;
  HighsInt *pHVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  double *pdVar8;
  int *piVar9;
  double *pdVar10;
  FreeColSubstitution local_50;
  
  pNVar3 = (this->rowValues).
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->rowValues).
      super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar3) {
    (this->rowValues).
    super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar3;
  }
  piVar9 = rowVec->nodeIndex;
  pdVar10 = rowVec->nodeValue;
  pHVar4 = rowVec->nodePositions;
  iVar1 = rowVec->len;
  iVar6 = 0;
  for (lVar7 = 0; (long)iVar1 * 4 != lVar7; lVar7 = lVar7 + 4) {
    iVar2 = *(int *)((long)pHVar4 + lVar7);
    iVar6 = iVar2 - iVar6;
    piVar9 = piVar9 + iVar6;
    pdVar10 = pdVar10 + iVar6;
    local_50.rhs = *pdVar10;
    std::
    vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
    ::emplace_back<int&,double>
              ((vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
                *)&this->rowValues,
               (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + *piVar9,&local_50.rhs);
    iVar6 = iVar2;
  }
  pNVar3 = (this->colValues).
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->colValues).
      super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar3) {
    (this->colValues).
    super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar3;
  }
  lVar7 = (long)colVec->head;
  pdVar10 = (double *)(colVec->nodeIndex + lVar7);
  if (lVar7 == -1) {
    pdVar10 = (double *)0x0;
  }
  pHVar4 = colVec->nodeNext;
  pdVar8 = colVec->nodeValue + lVar7;
  if (lVar7 == -1) {
    pdVar8 = (double *)0x0;
  }
  while ((int)lVar7 != -1) {
    local_50.rhs = *pdVar8;
    std::
    vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
    ::emplace_back<int&,double>
              ((vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
                *)&this->colValues,
               (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + *(int *)pdVar10,&local_50.rhs);
    lVar5 = (long)(int)lVar7;
    lVar7 = (long)pHVar4[lVar5];
    pdVar10 = (double *)((long)pdVar10 + lVar7 * 4 + lVar5 * -4);
    pdVar8 = pdVar8 + (lVar7 - lVar5);
  }
  this_00 = &this->reductionValues;
  local_50.row = (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[row];
  local_50.col = (this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[col];
  local_50.rhs = rhs;
  local_50.colCost = colCost;
  local_50.rowType = rowType;
  HighsDataStack::push<presolve::HighsPostsolveStack::FreeColSubstitution,_0>(this_00,&local_50);
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>(this_00,&this->rowValues);
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>(this_00,&this->colValues);
  reductionAdded(this,kFreeColSubstitution);
  return;
}

Assistant:

void freeColSubstitution(HighsInt row, HighsInt col, double rhs,
                           double colCost, RowType rowType,
                           const HighsMatrixSlice<RowStorageFormat>& rowVec,
                           const HighsMatrixSlice<ColStorageFormat>& colVec) {
    rowValues.clear();
    for (const HighsSliceNonzero& rowVal : rowVec)
      rowValues.emplace_back(origColIndex[rowVal.index()], rowVal.value());

    colValues.clear();
    for (const HighsSliceNonzero& colVal : colVec)
      colValues.emplace_back(origRowIndex[colVal.index()], colVal.value());

    reductionValues.push(FreeColSubstitution{rhs, colCost, origRowIndex[row],
                                             origColIndex[col], rowType});
    reductionValues.push(rowValues);
    reductionValues.push(colValues);
    reductionAdded(ReductionType::kFreeColSubstitution);
  }